

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall TTD::ThreadContextTTD::CleanRecordWeakRootMap(ThreadContextTTD *this)

{
  int iVar1;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar2;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_00;
  int nextIndex;
  int i_00;
  int i;
  long lVar3;
  int previous;
  
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
            ::operator->(&this->m_ttdRecordRootWeakMap);
  for (lVar3 = 0; lVar3 < this_00->size; lVar3 = lVar3 + 1) {
    iVar1 = (this_00->buckets).ptr[lVar3];
    if (iVar1 != -1) {
      i_00 = -1;
      while (previous = i_00, i_00 = iVar1, i_00 != -1) {
        pWVar2 = (this_00->entries).ptr;
        iVar1 = pWVar2[i_00].next;
        if (((pWVar2[i_00].key.ptr)->super_RecyclerWeakReferenceBase).strongRef == (Type)0x0) {
          JsUtil::
          WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
          ::RemoveEntry(this_00,i_00,previous,(uint)lVar3);
          i_00 = previous;
        }
      }
    }
  }
  return;
}

Assistant:

void ThreadContextTTD::CleanRecordWeakRootMap()
    {
        this->m_ttdRecordRootWeakMap->Map([&](Js::RecyclableObject* key, bool, const RecyclerWeakReference<Js::RecyclableObject>*)
        {
            ; //nop just map to force the clean
        });
    }